

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# URResolution.cpp
# Opt level: O0

void __thiscall
Inferences::URResolution::Item::Item
          (Item *this,Clause *cl,bool selectedOnly,URResolution *parent,bool mustResolveAll)

{
  bool bVar1;
  Color CVar2;
  uint uVar3;
  QuestionAnsweringMode QVar4;
  uint uVar5;
  Stack<Kernel::Literal_*> *capacity;
  Literal **ppLVar6;
  undefined8 in_RCX;
  byte in_DL;
  Clause *in_RSI;
  long in_RDI;
  byte in_R8B;
  uint i;
  uint nonGroundCnt;
  uint litslen;
  bool synthesis;
  uint clen;
  Literal *in_stack_ffffffffffffff48;
  undefined4 in_stack_ffffffffffffff50;
  undefined4 in_stack_ffffffffffffff54;
  undefined4 in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff5c;
  Stack<Kernel::Literal_*> *in_stack_ffffffffffffff60;
  bool local_8a;
  bool local_89;
  Stack<Kernel::Literal_*> *in_stack_ffffffffffffff80;
  uint local_50;
  uint local_4c;
  
  *(Clause **)(in_RDI + 8) = in_RSI;
  CVar2 = Kernel::Clause::color
                    ((Clause *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50));
  *(Color *)(in_RDI + 0x10) = CVar2;
  Lib::DArray<Kernel::Clause_*>::DArray
            ((DArray<Kernel::Clause_*> *)in_stack_ffffffffffffff60,
             CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
  Lib::Stack<Kernel::Literal_*>::Stack
            (in_stack_ffffffffffffff60,CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58)
            );
  *(undefined8 *)(in_RDI + 0x60) = in_RCX;
  uVar3 = Kernel::Clause::length(in_RSI);
  QVar4 = Shell::Options::questionAnswering(Lib::env);
  if (QVar4 == SYNTHESIS) {
    capacity = (Stack<Kernel::Literal_*> *)
               Kernel::Clause::getAnswerLiteral
                         ((Clause *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
    in_stack_ffffffffffffff80 = capacity;
  }
  else {
    capacity = (Stack<Kernel::Literal_*> *)0x0;
  }
  *(Stack<Kernel::Literal_*> **)(in_RDI + 0x50) = capacity;
  local_89 = true;
  if ((in_R8B & 1) == 0) {
    if ((in_DL & 1) == 0) {
      local_8a = uVar3 < (*(long *)(in_RDI + 0x50) != 0) + 2;
    }
    else {
      local_8a = true;
    }
    local_89 = local_8a;
  }
  *(bool *)in_RDI = local_89;
  uVar5 = (uVar3 - 1) + (uint)(*(long *)(in_RDI + 0x50) == 0);
  Lib::DArray<Kernel::Clause_*>::init
            ((DArray<Kernel::Clause_*> *)(in_RDI + 0x18),(EVP_PKEY_CTX *)(ulong)uVar5);
  Lib::Stack<Kernel::Literal_*>::reserve(in_stack_ffffffffffffff80,(size_t)capacity);
  local_4c = 0;
  for (local_50 = 0; local_50 < uVar3; local_50 = local_50 + 1) {
    ppLVar6 = Kernel::Clause::operator[](in_RSI,local_50);
    if (*ppLVar6 != *(Literal **)(in_RDI + 0x50)) {
      Kernel::Clause::operator[](in_RSI,local_50);
      Lib::Stack<Kernel::Literal_*>::push
                ((Stack<Kernel::Literal_*> *)
                 CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                 in_stack_ffffffffffffff48);
      Lib::Stack<Kernel::Literal_*>::top((Stack<Kernel::Literal_*> *)(in_RDI + 0x30));
      bVar1 = Kernel::Term::ground((Term *)0x83ef0c);
      if (!bVar1) {
        local_4c = local_4c + 1;
      }
    }
  }
  *(bool *)(in_RDI + 1) = local_4c < 2;
  if ((in_DL & 1) != 0) {
    uVar5 = Kernel::Clause::numSelected(in_RSI);
  }
  *(uint *)(in_RDI + 0x58) = uVar5;
  return;
}

Assistant:

Item(Clause* cl, bool selectedOnly, URResolution& parent, bool mustResolveAll)
  : _orig(cl), _color(cl->color()), _parent(parent)
  {
    unsigned clen = cl->length();
    bool synthesis = (env.options->questionAnswering() == Options::QuestionAnsweringMode::SYNTHESIS);
    _ansLit = synthesis ? cl->getAnswerLiteral() : nullptr;
    _mustResolveAll = mustResolveAll || (selectedOnly ? true : (clen < 2 + (_ansLit ? 1 : 0)));
    unsigned litslen = clen - (_ansLit ? 1 : 0);
    _premises.init(litslen, 0);
    _lits.reserve(litslen);
    unsigned nonGroundCnt = 0;
    for(unsigned i=0; i<clen; i++) {
      if ((*cl)[i] != _ansLit) {
        _lits.push((*cl)[i]);
        if(!_lits.top()->ground()) nonGroundCnt++;
      }
    }
    _atMostOneNonGround = nonGroundCnt<=1;

    _activeLength = selectedOnly ? cl->numSelected() : litslen;
    ASS_REP2(_activeLength>=litslen-1, cl->toString(), cl->numSelected());
  }